

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>
wasm::Builder::makeExport(Name name,Name value,ExternalKind kind)

{
  undefined8 *puVar1;
  long lVar2;
  __uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true> _Var3;
  undefined4 in_register_00000084;
  undefined4 in_R9D;
  
  _Var3.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
  super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl = name.super_IString.str._M_len;
  std::make_unique<wasm::Export>();
  puVar1 = *(undefined8 **)
            _Var3.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
            super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
  *puVar1 = name.super_IString.str._M_str;
  puVar1[1] = value.super_IString.str._M_len;
  lVar2 = *(long *)_Var3.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>.
                   _M_t.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                   super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
  *(char **)(lVar2 + 0x10) = value.super_IString.str._M_str;
  *(ulong *)(lVar2 + 0x18) = CONCAT44(in_register_00000084,kind);
  *(undefined4 *)
   (*(long *)_Var3.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
             super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl + 0x20) = in_R9D;
  return (__uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true>)
         (tuple<wasm::Export_*,_std::default_delete<wasm::Export>_>)
         _Var3.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
         super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
         super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
}

Assistant:

static std::unique_ptr<Export>
  makeExport(Name name, Name value, ExternalKind kind) {
    auto export_ = std::make_unique<Export>();
    export_->name = name;
    export_->value = value;
    export_->kind = kind;
    return export_;
  }